

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

void phmap::priv::(anonymous_namespace)::
     DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multiset<long,phmap::Less<long>,std::allocator<long>>,std::multiset<long,std::less<long>,std::allocator<long>>>,long>
               (char *param_1,
               multi_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
               *b,vector<long,_std::allocator<long>_> *values)

{
  multiset<long,_std::less<long>,_std::allocator<long>_> *this;
  tuple<phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
  tVar1;
  size_type sVar2;
  size_type sVar3;
  base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
  *pbVar4;
  size_type sVar5;
  template_ElementType<2UL> *ptVar6;
  EVP_PKEY_CTX *ctx;
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
  *siglen;
  iterator iVar7;
  node_type *pnVar8;
  multi_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
  *lhs;
  AssertionResult *pAVar9;
  AssertionResult *siglen_00;
  size_t siglen_01;
  AssertionResult *siglen_02;
  AssertHelper *pAVar10;
  _Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
  _Var11;
  uchar *sig;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *puVar12;
  uchar *sig_01;
  uchar *sig_02;
  uchar *sig_03;
  uchar *sig_04;
  size_t i_7;
  long lVar13;
  pointer *__ptr;
  char *pcVar14;
  AssertionResult *pAVar15;
  AssertionResult *pAVar16;
  AssertHelper *pAVar17;
  size_t in_R9;
  size_t i_1;
  base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
  *this_00;
  size_t i;
  ulong uVar18;
  long *__v;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>,_const_long_&,_const_long_*>
  b_00;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>,_long_&,_long_*>
  b_01;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>,_long_&,_long_*>
  b_02;
  iterator begin;
  iterator begin_00;
  iterator iVar19;
  const_iterator cVar20;
  const_iterator cVar21;
  iterator iVar22;
  iterator iVar23;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>,_const_long_&,_const_long_*>
  e;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>,_long_&,_long_*>
  e_00;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>,_long_&,_long_*>
  e_01;
  iterator end;
  iterator end_00;
  iterator end_01;
  iterator end_02;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_17;
  AssertHelper local_108;
  AssertHelper local_100;
  base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
  *local_f8;
  multi_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
  b_range;
  multi_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
  b_copy;
  uchar *sig_00;
  
  pAVar9 = &gtest_ar_16;
  siglen_00 = &gtest_ar_16;
  siglen_02 = &gtest_ar_16;
  pAVar15 = &gtest_ar_16;
  lVar13 = 0;
  for (uVar18 = 0;
      tVar1.
      super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
      .
      super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
      .
      super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
      .
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
      ._M_head_impl =
           (b->
           super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
           ).tree_.
           super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
           .
           super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
           .tree_.root_.
           super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
      , uVar18 < (ulong)((long)(b->
                               super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                               ).tree_.
                               super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                               .
                               super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                               .tree_.rightmost_ -
                         (long)tVar1.
                               super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                               .
                               super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                               .
                               super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                               .
                               super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                               ._M_head_impl >> 3); uVar18 = uVar18 + 1) {
    anon_unknown_0::
    multi_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::insert((multi_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
              *)param_1,
             (value_type *)
             ((long)tVar1.
                    super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                    .
                    super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                    .
                    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                    .
                    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                    ._M_head_impl + lVar13));
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::value_check((base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                   *)param_1,
                  (value_type *)
                  ((long)(b->
                         super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                         ).tree_.
                         super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                         .
                         super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                         .tree_.root_.
                         super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                  + lVar13));
    lVar13 = lVar13 + 8;
  }
  b_range.
  super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
  .tree_.
  super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        )base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
         ::size((base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                 *)param_1);
  lhs = &b_range;
  lVar13 = (long)(b->
                 super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                 ).tree_.
                 super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                 .
                 super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                 .tree_.rightmost_ -
           (long)(b->
                 super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                 ).tree_.
                 super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                 .
                 super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                 .tree_.root_.
                 super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
  ;
  pAVar16 = &gtest_ar_2;
  gtest_ar_2.success_ = SUB81(lVar13 >> 3,0);
  gtest_ar_2._1_7_ = SUB87(lVar13 >> 0xb,0);
  pcVar14 = "mutable_b.size()";
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&b_copy,"mutable_b.size()","values.size()",(unsigned_long *)lhs,
             (unsigned_long *)pAVar16);
  if ((char)b_copy.
            super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
            .tree_.
            super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
            .
            super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
            .tree_.root_.
            super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
            .
            super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
            .
            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
            .
            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
            ._M_head_impl == '\0') {
    testing::Message::Message((Message *)&b_range);
    if (b_copy.
        super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
        .tree_.
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
        .tree_.rightmost_ == (node_type *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)b_copy.
                          super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                          .tree_.
                          super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                          .
                          super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                          .tree_.rightmost_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x1b0,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&b_range);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if (b_range.
        super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
        .tree_.
        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
        .tree_.root_.
        super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
         )0x0) {
      (**(code **)(*(long *)b_range.
                            super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                            .tree_.
                            super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                            .
                            super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                            .tree_.root_.
                            super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                            .
                            super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                            .
                            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                            .
                            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&b_copy.
                      super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                      .tree_.
                      super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                      .
                      super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                      .tree_.rightmost_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&b_copy.
                      super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                      .tree_.
                      super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                      .
                      super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                      .tree_.rightmost_);
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::verify((base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
              *)param_1,(EVP_PKEY_CTX *)pcVar14,sig,(size_t)lhs,&pAVar16->success_,in_R9);
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::base_checker(&b_copy.
                    super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                   ,(base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                     *)param_1);
    sVar5 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
            ::size(&b_copy.
                    super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                  );
    gtest_ar_2.success_ = SUB81(sVar5,0);
    gtest_ar_2._1_7_ = SUB87(sVar5 >> 8,0);
    sVar5 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
            ::size((base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                    *)param_1);
    gtest_ar_16._0_4_ = SUB84(sVar5,0);
    gtest_ar_16._4_4_ = SUB84(sVar5 >> 0x20,0);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&b_range,"b_copy.size()","const_b.size()",(unsigned_long *)&gtest_ar_2,
               (unsigned_long *)&gtest_ar_16);
    if ((char)b_range.
              super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
              .tree_.
              super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
              .tree_.root_.
              super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
              .
              super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
              .
              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
              .
              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
              ._M_head_impl == '\0') {
      testing::Message::Message((Message *)&gtest_ar_2);
      if (b_range.
          super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
          .tree_.
          super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
          .
          super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
          .tree_.rightmost_ == (node_type *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = *(char **)b_range.
                            super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                            .tree_.
                            super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                            .
                            super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                            .tree_.rightmost_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_16,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1b6,pcVar14);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_16,(Message *)&gtest_ar_2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16);
      if ((long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) + 8))();
      }
    }
    local_f8 = (base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                *)param_1;
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&b_range.
                      super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                      .tree_.
                      super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                      .
                      super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                      .tree_.rightmost_);
    lVar13 = 0;
    for (uVar18 = 0; pbVar4 = local_f8,
        tVar1.
        super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
        ._M_head_impl =
             (b->
             super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
             ).tree_.
             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
             .tree_.root_.
             super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        , uVar18 < (ulong)((long)(b->
                                 super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                                 ).tree_.
                                 super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                 .
                                 super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                 .tree_.rightmost_ -
                           (long)tVar1.
                                 super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                                 ._M_head_impl >> 3); uVar18 = uVar18 + 1) {
      iVar19 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
               ::find(&b_copy.
                       super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                      ,(key_type *)
                       ((long)tVar1.
                              super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                              .
                              super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                              .
                              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                              .
                              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                              ._M_head_impl + lVar13));
      ptVar6 = btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
               ::GetField<2ul>((btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                                *)iVar19.node);
      CheckPairEquals<long,long>
                (ptVar6 + iVar19.position,
                 (long *)((long)(b->
                                super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                                ).tree_.
                                super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                .
                                super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                .tree_.root_.
                                super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                         + lVar13));
      lVar13 = lVar13 + 8;
    }
    cVar20 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
             ::begin((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                      *)local_f8);
    cVar21 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
             ::end((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                    *)pbVar4);
    b_00._12_4_ = 0;
    b_00.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                 *)SUB128(cVar20._0_12_,0);
    b_00.position = SUB124(cVar20._0_12_,8);
    e._12_4_ = 0;
    e.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
              *)SUB128(cVar21._0_12_,0);
    e.position = SUB124(cVar21._0_12_,8);
    base_checker<phmap::btree_multiset<long,phmap::Less<long>,std::allocator<long>>,std::multiset<long,std::less<long>,std::allocator<long>>>
    ::
    base_checker<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>const,long_const&,long_const*>>
              ((base_checker<phmap::btree_multiset<long,phmap::Less<long>,std::allocator<long>>,std::multiset<long,std::less<long>,std::allocator<long>>>
                *)&b_range,b_00,e);
    sVar5 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
            ::size(&b_range.
                    super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                  );
    gtest_ar_16._0_4_ = SUB84(sVar5,0);
    gtest_ar_16._4_4_ = SUB84(sVar5 >> 0x20,0);
    gtest_ar_17._0_8_ =
         base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
         ::size(pbVar4);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_2,"b_range.size()","const_b.size()",
               (unsigned_long *)&gtest_ar_16,(unsigned_long *)&gtest_ar_17);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_16);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = *(char **)CONCAT44(gtest_ar_2.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)gtest_ar_2.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1bd,pcVar14);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_16);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if ((long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    lVar13 = 0;
    for (uVar18 = 0;
        tVar1.
        super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
        ._M_head_impl =
             (b->
             super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
             ).tree_.
             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
             .tree_.root_.
             super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        , uVar18 < (ulong)((long)(b->
                                 super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                                 ).tree_.
                                 super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                 .
                                 super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                 .tree_.rightmost_ -
                           (long)tVar1.
                                 super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                                 ._M_head_impl >> 3); uVar18 = uVar18 + 1) {
      iVar19 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
               ::find(&b_range.
                       super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                      ,(key_type *)
                       ((long)tVar1.
                              super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                              .
                              super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                              .
                              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                              .
                              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                              ._M_head_impl + lVar13));
      ptVar6 = btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
               ::GetField<2ul>((btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                                *)iVar19.node);
      CheckPairEquals<long,long>
                (ptVar6 + iVar19.position,
                 (long *)((long)(b->
                                super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                                ).tree_.
                                super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                .
                                super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                .tree_.root_.
                                super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                         + lVar13));
      lVar13 = lVar13 + 8;
    }
    iVar22 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
             ::begin((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                      *)&b_copy);
    ctx = (EVP_PKEY_CTX *)iVar22.node;
    iVar23 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
             ::end((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                    *)&b_copy);
    siglen = iVar23.node;
    b_01._12_4_ = 0;
    b_01.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                 *)SUB128(iVar22._0_12_,0);
    b_01.position = SUB124(iVar22._0_12_,8);
    e_00._12_4_ = 0;
    e_00.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                 *)SUB128(iVar23._0_12_,0);
    e_00.position = SUB124(iVar23._0_12_,8);
    puVar12 = (uchar *)(ulong)(uint)iVar23.position;
    multi_checker<phmap::btree_multiset<long,phmap::Less<long>,std::allocator<long>>,std::multiset<long,std::less<long>,std::allocator<long>>>
    ::
    insert<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>,long&,long*>>
              ((multi_checker<phmap::btree_multiset<long,phmap::Less<long>,std::allocator<long>>,std::multiset<long,std::less<long>,std::allocator<long>>>
                *)&b_range,b_01,e_00);
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::verify(&b_range.
              super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
             ,ctx,sig_00,(size_t)siglen,puVar12,in_R9);
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::clear(&b_range.
             super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
           );
    iVar22 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
             ::begin((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                      *)&b_copy);
    iVar23 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
             ::end((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                    *)&b_copy);
    b_02._12_4_ = 0;
    b_02.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                 *)SUB128(iVar22._0_12_,0);
    b_02.position = SUB124(iVar22._0_12_,8);
    e_01._12_4_ = 0;
    e_01.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                 *)SUB128(iVar23._0_12_,0);
    e_01.position = SUB124(iVar23._0_12_,8);
    multi_checker<phmap::btree_multiset<long,phmap::Less<long>,std::allocator<long>>,std::multiset<long,std::less<long>,std::allocator<long>>>
    ::
    insert<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>,long&,long*>>
              ((multi_checker<phmap::btree_multiset<long,phmap::Less<long>,std::allocator<long>>,std::multiset<long,std::less<long>,std::allocator<long>>>
                *)&b_range,b_02,e_01);
    sVar5 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
            ::size(&b_range.
                    super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                  );
    gtest_ar_16._0_4_ = SUB84(sVar5,0);
    gtest_ar_16._4_4_ = SUB84(sVar5 >> 0x20,0);
    gtest_ar_17._0_8_ =
         base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
         ::size(&b_copy.
                 super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
               );
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_2,"b_range.size()","b_copy.size()",
               (unsigned_long *)&gtest_ar_16,(unsigned_long *)&gtest_ar_17);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_16);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = *(char **)CONCAT44(gtest_ar_2.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)gtest_ar_2.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1c9,pcVar14);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_16);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if ((long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    lVar13 = 0;
    for (uVar18 = 0;
        tVar1.
        super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
        ._M_head_impl =
             (b->
             super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
             ).tree_.
             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
             .tree_.root_.
             super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        , uVar18 < (ulong)((long)(b->
                                 super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                                 ).tree_.
                                 super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                 .
                                 super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                 .tree_.rightmost_ -
                           (long)tVar1.
                                 super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                                 ._M_head_impl >> 3); uVar18 = uVar18 + 1) {
      iVar19 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
               ::find(&b_range.
                       super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                      ,(key_type *)
                       ((long)tVar1.
                              super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                              .
                              super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                              .
                              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                              .
                              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                              ._M_head_impl + lVar13));
      ptVar6 = btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
               ::GetField<2ul>((btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                                *)iVar19.node);
      CheckPairEquals<long,long>
                (ptVar6 + iVar19.position,
                 (long *)((long)(b->
                                super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                                ).tree_.
                                super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                .
                                super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                .tree_.root_.
                                super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                         + lVar13));
      lVar13 = lVar13 + 8;
    }
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::operator=(&b_range.
                 super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                ,&b_range.
                  super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
               );
    pbVar4 = local_f8;
    sVar5 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
            ::size(&b_range.
                    super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                  );
    gtest_ar_16._0_4_ = SUB84(sVar5,0);
    gtest_ar_16._4_4_ = SUB84(sVar5 >> 0x20,0);
    gtest_ar_17._0_8_ =
         base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
         ::size(&b_copy.
                 super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
               );
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_2,"b_range.size()","b_copy.size()",
               (unsigned_long *)&gtest_ar_16,(unsigned_long *)&gtest_ar_17);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_16);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = *(char **)CONCAT44(gtest_ar_2.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)gtest_ar_2.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1d0,pcVar14);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_16);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if ((long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::clear(&b_range.
             super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
           );
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::operator=(&b_range.
                 super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                ,&b_copy.
                  super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
               );
    sVar5 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
            ::size(&b_range.
                    super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                  );
    gtest_ar_16._0_4_ = SUB84(sVar5,0);
    gtest_ar_16._4_4_ = SUB84(sVar5 >> 0x20,0);
    gtest_ar_17._0_8_ =
         base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
         ::size(&b_copy.
                 super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
               );
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_2,"b_range.size()","b_copy.size()",
               (unsigned_long *)&gtest_ar_16,(unsigned_long *)&gtest_ar_17);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_16);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = *(char **)CONCAT44(gtest_ar_2.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)gtest_ar_2.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1d5,pcVar14);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_16);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if ((long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::clear(&b_range.
             super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
           );
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::swap(&b_range.
            super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
           ,&b_copy.
             super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
          );
    sVar5 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
            ::size(&b_copy.
                    super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                  );
    gtest_ar_16._0_4_ = SUB84(sVar5,0);
    gtest_ar_16._4_4_ = SUB84(sVar5 >> 0x20,0);
    gtest_ar_17._0_8_ = gtest_ar_17._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&gtest_ar_2,"b_copy.size()","0",(unsigned_long *)&gtest_ar_16,
               (int *)&gtest_ar_17);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_16);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = *(char **)CONCAT44(gtest_ar_2.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)gtest_ar_2.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1da,pcVar14);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_16);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if ((long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    sVar5 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
            ::size(&b_range.
                    super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                  );
    gtest_ar_16._0_4_ = SUB84(sVar5,0);
    gtest_ar_16._4_4_ = SUB84(sVar5 >> 0x20,0);
    gtest_ar_17._0_8_ =
         base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
         ::size(pbVar4);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_2,"b_range.size()","const_b.size()",
               (unsigned_long *)&gtest_ar_16,(unsigned_long *)&gtest_ar_17);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_16);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = *(char **)CONCAT44(gtest_ar_2.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)gtest_ar_2.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1db,pcVar14);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_16);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if ((long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    lVar13 = 0;
    for (uVar18 = 0;
        tVar1.
        super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
        ._M_head_impl =
             (b->
             super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
             ).tree_.
             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
             .tree_.root_.
             super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        , uVar18 < (ulong)((long)(b->
                                 super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                                 ).tree_.
                                 super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                 .
                                 super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                 .tree_.rightmost_ -
                           (long)tVar1.
                                 super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                                 ._M_head_impl >> 3); uVar18 = uVar18 + 1) {
      iVar19 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
               ::find(&b_range.
                       super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                      ,(key_type *)
                       ((long)tVar1.
                              super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                              .
                              super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                              .
                              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                              .
                              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                              ._M_head_impl + lVar13));
      ptVar6 = btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
               ::GetField<2ul>((btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                                *)iVar19.node);
      CheckPairEquals<long,long>
                (ptVar6 + iVar19.position,
                 (long *)((long)(b->
                                super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                                ).tree_.
                                super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                .
                                super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                .tree_.root_.
                                super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                         + lVar13));
      lVar13 = lVar13 + 8;
    }
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::swap(&b_range.
            super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
           ,&b_copy.
             super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
          );
    pbVar4 = local_f8;
    std::
    swap<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multiset<long,phmap::Less<long>,std::allocator<long>>,std::multiset<long,std::less<long>,std::allocator<long>>>>
              (&b_range,&b_copy);
    sVar5 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
            ::size(&b_copy.
                    super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                  );
    gtest_ar_16._0_4_ = SUB84(sVar5,0);
    gtest_ar_16._4_4_ = SUB84(sVar5 >> 0x20,0);
    gtest_ar_17._0_8_ = gtest_ar_17._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&gtest_ar_2,"b_copy.size()","0",(unsigned_long *)&gtest_ar_16,
               (int *)&gtest_ar_17);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_16);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = *(char **)CONCAT44(gtest_ar_2.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)gtest_ar_2.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1e3,pcVar14);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_16);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if ((long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    sVar5 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
            ::size(&b_range.
                    super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                  );
    gtest_ar_16._0_4_ = SUB84(sVar5,0);
    gtest_ar_16._4_4_ = SUB84(sVar5 >> 0x20,0);
    gtest_ar_17._0_8_ =
         base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
         ::size(pbVar4);
    pAVar16 = &gtest_ar_17;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_2,"b_range.size()","const_b.size()",
               (unsigned_long *)&gtest_ar_16,(unsigned_long *)pAVar16);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_16);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pAVar16 = (AssertionResult *)0x415b6f;
      }
      else {
        pAVar16 = *(AssertionResult **)
                   CONCAT44(gtest_ar_2.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_,
                            (int)gtest_ar_2.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl);
      }
      pAVar9 = (AssertionResult *)0x1e4;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1e4,&pAVar16->success_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_16);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if ((long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    lVar13 = 0;
    for (uVar18 = 0;
        tVar1.
        super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
        ._M_head_impl =
             (b->
             super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
             ).tree_.
             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
             .tree_.root_.
             super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        , uVar18 < (ulong)((long)(b->
                                 super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                                 ).tree_.
                                 super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                 .
                                 super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                 .tree_.rightmost_ -
                           (long)tVar1.
                                 super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                                 ._M_head_impl >> 3); uVar18 = uVar18 + 1) {
      iVar19 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
               ::find(&b_range.
                       super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                      ,(key_type *)
                       ((long)tVar1.
                              super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                              .
                              super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                              .
                              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                              .
                              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                              ._M_head_impl + lVar13));
      ptVar6 = btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
               ::GetField<2ul>((btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                                *)iVar19.node);
      pAVar9 = (AssertionResult *)(long)iVar19.position;
      CheckPairEquals<long,long>
                (ptVar6 + (long)pAVar9,
                 (long *)((long)(b->
                                super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                                ).tree_.
                                super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                .
                                super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                .tree_.root_.
                                super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                         + lVar13));
      lVar13 = lVar13 + 8;
    }
    std::
    swap<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multiset<long,phmap::Less<long>,std::allocator<long>>,std::multiset<long,std::less<long>,std::allocator<long>>>>
              (&b_range,&b_copy);
    pbVar4 = local_f8;
    lVar13 = 0;
    puVar12 = extraout_RDX;
    for (uVar18 = 0; this_00 = local_f8,
        tVar1.
        super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
        ._M_head_impl =
             (b->
             super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
             ).tree_.
             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
             .tree_.root_.
             super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        , uVar18 < (ulong)((long)(b->
                                 super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                                 ).tree_.
                                 super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                 .
                                 super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                 .tree_.rightmost_ -
                           (long)tVar1.
                                 super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                                 ._M_head_impl >> 3); uVar18 = uVar18 + 1) {
      base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
      ::erase(pbVar4,(key_type *)
                     ((long)tVar1.
                            super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                            .
                            super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                            .
                            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                            .
                            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                            ._M_head_impl + lVar13));
      gtest_ar_16._0_4_ =
           base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
           ::erase(pbVar4,(key_type *)
                          ((long)(b->
                                 super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                                 ).tree_.
                                 super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                 .
                                 super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                 .tree_.root_.
                                 super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                          + lVar13));
      gtest_ar_17._0_8_ = gtest_ar_17._0_8_ & 0xffffffff00000000;
      pAVar9 = &gtest_ar_16;
      pAVar16 = &gtest_ar_17;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_2,"mutable_b.erase(key_of_value(values[i]))","0",
                 (int *)&gtest_ar_16,(int *)&gtest_ar_17);
      if (gtest_ar_2.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_16);
        if ((undefined8 *)
            CONCAT44(gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_,
                     (int)gtest_ar_2.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl) == (undefined8 *)0x0) {
          pcVar14 = "";
        }
        else {
          pcVar14 = *(char **)CONCAT44(gtest_ar_2.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (int)gtest_ar_2.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_17,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x1ee,pcVar14);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_16);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
        if ((long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_2.message_);
        goto LAB_00153201;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_2.message_);
      lVar13 = lVar13 + 8;
      puVar12 = extraout_RDX_00;
    }
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::verify(local_f8,(EVP_PKEY_CTX *)
                      tVar1.
                      super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                      .
                      super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                      .
                      super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                      .
                      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                      ._M_head_impl,puVar12,(size_t)pAVar9,&pAVar16->success_,in_R9);
    sVar5 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
            ::size(this_00);
    gtest_ar_16._0_4_ = SUB84(sVar5,0);
    gtest_ar_16._4_4_ = SUB84(sVar5 >> 0x20,0);
    pAVar9 = &gtest_ar_17;
    gtest_ar_17._0_8_ = gtest_ar_17._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&gtest_ar_2,"const_b.size()","0",(unsigned_long *)&gtest_ar_16,
               (int *)pAVar9);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_16);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pAVar9 = (AssertionResult *)0x415b6f;
      }
      else {
        pAVar9 = *(AssertionResult **)
                  CONCAT44(gtest_ar_2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (int)gtest_ar_2.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
      }
      siglen_00 = (AssertionResult *)0x1f2;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1f2,&pAVar9->success_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_16);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if ((long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::operator=(this_00,&b_copy.
                         super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
               );
    lVar13 = 0;
    puVar12 = extraout_RDX_01;
    for (uVar18 = 0;
        tVar1.
        super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
        ._M_head_impl =
             (b->
             super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
             ).tree_.
             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
             .tree_.root_.
             super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        , uVar18 < (ulong)((long)(b->
                                 super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                                 ).tree_.
                                 super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                 .
                                 super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                 .tree_.rightmost_ -
                           (long)tVar1.
                                 super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                 .
                                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                                 ._M_head_impl >> 3); uVar18 = uVar18 + 1) {
      iVar19 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
               ::find(this_00,(key_type *)
                              ((long)tVar1.
                                     super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                     .
                                     super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                     .
                                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                     .
                                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                                     ._M_head_impl + lVar13));
      iVar19 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
               ::erase(this_00,iVar19);
      puVar12 = iVar19._8_8_;
      lVar13 = lVar13 + 8;
    }
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::verify(this_00,(EVP_PKEY_CTX *)
                     tVar1.
                     super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                     ._M_head_impl,puVar12,(size_t)siglen_00,&pAVar9->success_,in_R9);
    sVar5 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
            ::size(this_00);
    gtest_ar_16._0_4_ = SUB84(sVar5,0);
    gtest_ar_16._4_4_ = SUB84(sVar5 >> 0x20,0);
    pAVar9 = &gtest_ar_17;
    gtest_ar_17._0_8_ = gtest_ar_17._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&gtest_ar_2,"const_b.size()","0",(unsigned_long *)&gtest_ar_16,
               (int *)pAVar9);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_16);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pAVar9 = (AssertionResult *)0x415b6f;
      }
      else {
        pAVar9 = *(AssertionResult **)
                  CONCAT44(gtest_ar_2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (int)gtest_ar_2.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1fb,&pAVar9->success_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_16);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if ((long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    this = &this_00->checker_;
    siglen_01 = 0;
    for (puVar12 = (uchar *)0x0;
        tVar1.
        super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
        ._M_head_impl =
             (b->
             super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
             ).tree_.
             super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
             .tree_.root_.
             super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
        , puVar12 < (uchar *)((long)(b->
                                    super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                                    ).tree_.
                                    super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                    .
                                    super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                                    .tree_.rightmost_ -
                              (long)tVar1.
                                    super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                    .
                                    super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                    .
                                    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                    .
                                    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                                    ._M_head_impl >> 3); puVar12 = puVar12 + 1) {
      iVar19 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
               ::upper_bound(this_00,(key_type *)
                                     ((long)tVar1.
                                            super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                            .
                                            super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                            .
                                            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                                            .
                                            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                                            ._M_head_impl + siglen_01));
      __v = (long *)((long)(b->
                           super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                           ).tree_.
                           super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                           .
                           super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                           .tree_.root_.
                           super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                    + siglen_01);
      sVar2 = (this_00->tree_).
              super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
              .tree_.size_;
      iVar7 = std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
              _M_insert_equal<long_const&>
                        ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                          *)this,__v);
      iVar22._12_4_ = 0;
      iVar22.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                     *)SUB128(iVar19._0_12_,0);
      iVar22.position = SUB124(iVar19._0_12_,8);
      iVar22 = btree<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
               ::insert_hint_multi<long_const&>
                         ((btree<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                           *)this_00,iVar22,__v);
      ptVar6 = btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
               ::GetField<2ul>((btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,true>>
                                *)iVar22.node);
      CheckPairEquals<long,long>(ptVar6 + iVar22.position,(long *)(iVar7._M_node + 1));
      sVar3 = (this_00->tree_).
              super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
              .tree_.size_;
      gtest_ar_16._0_4_ = SUB84(sVar3,0);
      gtest_ar_16._4_4_ = SUB84(sVar3 >> 0x20,0);
      gtest_ar_17._0_8_ = (this_00->checker_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar_2,"this->tree_.size()","this->checker_.size()",
                 (unsigned_long *)&gtest_ar_16,(unsigned_long *)&gtest_ar_17);
      pAVar9 = &gtest_ar_17;
      if (gtest_ar_2.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_16);
        pcVar14 = "";
        if ((undefined8 *)
            CONCAT44(gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_,
                     (int)gtest_ar_2.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl) != (undefined8 *)0x0) {
          pcVar14 = *(char **)CONCAT44(gtest_ar_2.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (int)gtest_ar_2.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)pAVar9,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x198,pcVar14);
        testing::internal::AssertHelper::operator=((AssertHelper *)pAVar9,(Message *)&gtest_ar_16);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pAVar9);
        if ((long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_2.message_);
      this_00 = local_f8;
      sVar3 = (local_f8->tree_).
              super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
              .tree_.size_;
      gtest_ar_16._0_4_ = SUB84(sVar3,0);
      gtest_ar_16._4_4_ = SUB84(sVar3 >> 0x20,0);
      gtest_ar_17._0_8_ = sVar2 + 1;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar_2,"this->tree_.size()","size + 1",
                 (unsigned_long *)&gtest_ar_16,(unsigned_long *)pAVar9);
      if (gtest_ar_2.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_16);
        pAVar9 = (AssertionResult *)0x415b6f;
        if ((undefined8 *)
            CONCAT44(gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_,
                     (int)gtest_ar_2.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl) != (undefined8 *)0x0) {
          pAVar9 = *(AssertionResult **)
                    CONCAT44(gtest_ar_2.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             (int)gtest_ar_2.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x199,&pAVar9->success_);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_16);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
        if ((long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_2.message_);
      siglen_01 = siglen_01 + 8;
    }
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::verify(this_00,(EVP_PKEY_CTX *)
                     tVar1.
                     super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<1UL,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                     ._M_head_impl,puVar12,siglen_01,&pAVar9->success_,in_R9);
    iVar22 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
             ::begin((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                      *)this_00);
    iVar23 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
             ::end((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                    *)this_00);
    iVar19._12_4_ = 0;
    iVar19.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                   *)SUB128(iVar22._0_12_,0);
    iVar19.position = SUB124(iVar22._0_12_,8);
    end._12_4_ = 0;
    end.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                *)SUB128(iVar23._0_12_,0);
    end.position = SUB124(iVar23._0_12_,8);
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::erase(this_00,iVar19,end);
    sVar5 = base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
            ::size(this_00);
    gtest_ar_16._0_4_ = SUB84(sVar5,0);
    gtest_ar_16._4_4_ = SUB84(sVar5 >> 0x20,0);
    pAVar9 = &gtest_ar_17;
    gtest_ar_17._0_8_ = gtest_ar_17._0_8_ & 0xffffffff00000000;
    pcVar14 = "mutable_b.size()";
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&gtest_ar_2,"mutable_b.size()","0",(unsigned_long *)&gtest_ar_16,
               (int *)pAVar9);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_16);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pAVar9 = (AssertionResult *)0x415b6f;
      }
      else {
        pAVar9 = *(AssertionResult **)
                  CONCAT44(gtest_ar_2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (int)gtest_ar_2.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
      }
      siglen_02 = (AssertionResult *)0x206;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x206,&pAVar9->success_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_16);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      pcVar14 = &pAVar15->success_;
      if ((long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) + 8))();
        pcVar14 = &pAVar15->success_;
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::verify(this_00,(EVP_PKEY_CTX *)pcVar14,sig_01,(size_t)siglen_02,&pAVar9->success_,in_R9);
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::operator=(this_00,&b_copy.
                         super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
               );
    iVar22 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
             ::begin((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                      *)this_00);
    gtest_ar_2.success_ = iVar22.node._0_1_;
    gtest_ar_2._1_7_ = iVar22.node._1_7_;
    gtest_ar_2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = iVar22.position;
    for (uVar18 = 0;
        uVar18 < (ulong)((long)(b->
                               super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                               ).tree_.
                               super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                               .
                               super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                               .tree_.rightmost_ -
                         (long)(b->
                               super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                               ).tree_.
                               super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                               .
                               super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                               .tree_.root_.
                               super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                        >> 3) >> 1; uVar18 = uVar18 + 1) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>,_long_&,_long_*>
      ::increment((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>,_long_&,_long_*>
                   *)&gtest_ar_2);
    }
    iVar22 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
             ::begin((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                      *)this_00);
    end_00.node._1_7_ = gtest_ar_2._1_7_;
    end_00.node._0_1_ = gtest_ar_2.success_;
    end_00.position =
         (int)gtest_ar_2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
    end_00._12_4_ = 0;
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::erase(this_00,iVar22,end_00);
    gtest_ar_17._0_8_ =
         base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
         ::size(this_00);
    pAVar9 = &gtest_ar_17;
    uVar18 = (long)(b->
                   super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                   ).tree_.
                   super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                   .
                   super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                   .tree_.rightmost_ -
             (long)(b->
                   super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                   ).tree_.
                   super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                   .
                   super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                   .tree_.root_.
                   super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
             >> 3;
    local_108.data_ = (AssertHelperData *)(uVar18 - (uVar18 >> 1));
    pAVar10 = &local_108;
    pcVar14 = "mutable_b.size()";
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_16,"mutable_b.size()","values.size() - values.size() / 2",
               (unsigned_long *)pAVar9,(unsigned_long *)pAVar10);
    if (gtest_ar_16.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_17);
      if ((undefined8 *)
          CONCAT44(gtest_ar_16.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_16.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pAVar10 = (AssertHelper *)0x415b6f;
      }
      else {
        pAVar10 = *(AssertHelper **)
                   CONCAT44(gtest_ar_16.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_,
                            (int)gtest_ar_16.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl);
      }
      pAVar9 = (AssertionResult *)0x20e;
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x20e,(char *)pAVar10);
      pcVar14 = &gtest_ar_17.success_;
      testing::internal::AssertHelper::operator=(&local_108,(Message *)pcVar14);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      if (gtest_ar_17._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_17._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_16.message_);
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::verify(this_00,(EVP_PKEY_CTX *)pcVar14,sig_02,(size_t)pAVar9,(uchar *)pAVar10,in_R9);
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::operator=(this_00,&b_copy.
                         super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
               );
    iVar22 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
             ::begin((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                      *)this_00);
    gtest_ar_16._0_4_ = iVar22.node._0_4_;
    gtest_ar_16._4_4_ = iVar22.node._4_4_;
    gtest_ar_16.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = iVar22.position;
    for (uVar18 = 0;
        uVar18 < (ulong)((long)(b->
                               super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                               ).tree_.
                               super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                               .
                               super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                               .tree_.rightmost_ -
                         (long)(b->
                               super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                               ).tree_.
                               super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                               .
                               super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                               .tree_.root_.
                               super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                        >> 3) >> 1; uVar18 = uVar18 + 1) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>,_long_&,_long_*>
      ::increment((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>,_long_&,_long_*>
                   *)&gtest_ar_16);
    }
    begin.node._4_4_ = gtest_ar_16._4_4_;
    begin.node._0_1_ = gtest_ar_16.success_;
    begin.node._1_3_ = gtest_ar_16._1_3_;
    begin.position =
         (int)gtest_ar_16.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
    iVar22 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
             ::end((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                    *)this_00);
    begin._12_4_ = 0;
    end_01._12_4_ = 0;
    end_01.node = (btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                   *)SUB128(iVar22._0_12_,0);
    end_01.position = SUB124(iVar22._0_12_,8);
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::erase(this_00,begin,end_01);
    local_108.data_ =
         (AssertHelperData *)
         base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
         ::size(this_00);
    pAVar10 = &local_108;
    local_100.data_ =
         (AssertHelperData *)
         ((ulong)((long)(b->
                        super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                        ).tree_.
                        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                        .
                        super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                        .tree_.rightmost_ -
                  (long)(b->
                        super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                        ).tree_.
                        super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                        .
                        super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                        .tree_.root_.
                        super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
                 >> 3) >> 1);
    pAVar17 = &local_100;
    pcVar14 = "mutable_b.size()";
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_17,"mutable_b.size()","values.size() / 2",
               (unsigned_long *)pAVar10,(unsigned_long *)pAVar17);
    if (gtest_ar_17.success_ == false) {
      testing::Message::Message((Message *)&local_108);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_17.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pAVar17 = (AssertHelper *)0x415b6f;
      }
      else {
        pAVar17 = *(AssertHelper **)
                   gtest_ar_17.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
      }
      pAVar10 = (AssertHelper *)0x216;
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x216,(char *)pAVar17);
      pcVar14 = (char *)&local_108;
      testing::internal::AssertHelper::operator=(&local_100,(Message *)pcVar14);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (local_108.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_108.data_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_17.message_);
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::verify(this_00,(EVP_PKEY_CTX *)pcVar14,sig_03,(size_t)pAVar10,(uchar *)pAVar17,in_R9);
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::operator=(this_00,&b_copy.
                         super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
               );
    iVar22 = btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
             ::begin((btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>
                      *)this_00);
    gtest_ar_16._0_4_ = iVar22.node._0_4_;
    gtest_ar_16._4_4_ = iVar22.node._4_4_;
    gtest_ar_16.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = iVar22.position;
    uVar18 = 0;
    while( true ) {
      _Var11.
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
      ._M_head_impl =
           *(_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
             *)&(b->
                super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                ).tree_.
                super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                .tree_.root_.
                super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
      ;
      pnVar8 = (b->
               super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
               ).tree_.
               super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
               .
               super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
               .tree_.rightmost_;
      if ((ulong)((long)pnVar8 -
                  (long)_Var11.
                        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                        ._M_head_impl >> 3) >> 2 <= uVar18) break;
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>,_long_&,_long_*>
      ::increment((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>,_long_&,_long_*>
                   *)&gtest_ar_16);
      uVar18 = uVar18 + 1;
    }
    gtest_ar_2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         (int)gtest_ar_16.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
    gtest_ar_2.success_ = gtest_ar_16.success_;
    gtest_ar_2._1_7_ = SUB87(CONCAT44(gtest_ar_16._4_4_,gtest_ar_16._0_4_) >> 8,0);
    for (uVar18 = 0;
        uVar18 < (ulong)((long)pnVar8 -
                         (long)_Var11.
                               super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
                               ._M_head_impl >> 3) >> 2; uVar18 = uVar18 + 1) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>,_long_&,_long_*>
      ::increment((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>,_long_&,_long_*>
                   *)&gtest_ar_2);
      _Var11.
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
      ._M_head_impl =
           *(_Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*,_false>
             *)&(b->
                super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                ).tree_.
                super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                .tree_.root_.
                super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
      ;
      pnVar8 = (b->
               super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
               ).tree_.
               super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
               .
               super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
               .tree_.rightmost_;
    }
    begin_00.node._4_4_ = gtest_ar_16._4_4_;
    begin_00.node._0_1_ = gtest_ar_16.success_;
    begin_00.node._1_3_ = gtest_ar_16._1_3_;
    begin_00.position =
         (int)gtest_ar_16.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
    end_02.node._1_7_ = gtest_ar_2._1_7_;
    end_02.node._0_1_ = gtest_ar_2.success_;
    end_02.position =
         (int)gtest_ar_2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
    begin_00._12_4_ = 0;
    end_02._12_4_ = 0;
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::erase(this_00,begin_00,end_02);
    local_108.data_ =
         (AssertHelperData *)
         base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
         ::size(this_00);
    pAVar10 = &local_108;
    uVar18 = (long)(b->
                   super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                   ).tree_.
                   super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                   .
                   super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                   .tree_.rightmost_ -
             (long)(b->
                   super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                   ).tree_.
                   super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                   .
                   super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_>
                   .tree_.root_.
                   super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_true>_>_*>
             >> 3;
    local_100.data_ = (AssertHelperData *)(uVar18 - (uVar18 >> 2));
    pAVar17 = &local_100;
    pcVar14 = "mutable_b.size()";
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_17,"mutable_b.size()","values.size() - values.size() / 4",
               (unsigned_long *)pAVar10,(unsigned_long *)pAVar17);
    if (gtest_ar_17.success_ == false) {
      testing::Message::Message((Message *)&local_108);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_17.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pAVar17 = (AssertHelper *)0x415b6f;
      }
      else {
        pAVar17 = *(AssertHelper **)
                   gtest_ar_17.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
      }
      pAVar10 = (AssertHelper *)0x220;
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x220,(char *)pAVar17);
      pcVar14 = (char *)&local_108;
      testing::internal::AssertHelper::operator=(&local_100,(Message *)pcVar14);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (local_108.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_108.data_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_17.message_);
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::verify(this_00,(EVP_PKEY_CTX *)pcVar14,sig_04,(size_t)pAVar10,(uchar *)pAVar17,in_R9);
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::clear(this_00);
LAB_00153201:
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::~base_checker(&b_range.
                     super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                   );
    base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
    ::~base_checker(&b_copy.
                     super_base_checker<phmap::btree_multiset<long,_phmap::Less<long>,_std::allocator<long>_>,_std::multiset<long,_std::less<long>,_std::allocator<long>_>_>
                   );
  }
  return;
}

Assistant:

void DoTest(const char *, T *b, const std::vector<V> &values) {
        typename KeyOfValue<typename T::key_type, V>::type key_of_value;

        T &mutable_b = *b;
        const T &const_b = *b;

        // Test insert.
        for (size_t i = 0; i < values.size(); ++i) {
            mutable_b.insert(values[i]);
            mutable_b.value_check(values[i]);
        }
        ASSERT_EQ(mutable_b.size(), values.size());

        const_b.verify();

        // Test copy constructor.
        T b_copy(const_b);
        EXPECT_EQ(b_copy.size(), const_b.size());
        for (size_t i = 0; i < values.size(); ++i) {
            CheckPairEquals(*b_copy.find(key_of_value(values[i])), values[i]);
        }

        // Test range constructor.
        T b_range(const_b.begin(), const_b.end());
        EXPECT_EQ(b_range.size(), const_b.size());
        for (size_t i = 0; i < values.size(); ++i) {
            CheckPairEquals(*b_range.find(key_of_value(values[i])), values[i]);
        }

        // Test range insertion for values that already exist.
        b_range.insert(b_copy.begin(), b_copy.end());
        b_range.verify();

        // Test range insertion for new values.
        b_range.clear();
        b_range.insert(b_copy.begin(), b_copy.end());
        EXPECT_EQ(b_range.size(), b_copy.size());
        for (size_t i = 0; i < values.size(); ++i) {
            CheckPairEquals(*b_range.find(key_of_value(values[i])), values[i]);
        }

        // Test assignment to self. Nothing should change.
        b_range.operator=(b_range);
        EXPECT_EQ(b_range.size(), b_copy.size());

        // Test assignment of new values.
        b_range.clear();
        b_range = b_copy;
        EXPECT_EQ(b_range.size(), b_copy.size());

        // Test swap.
        b_range.clear();
        b_range.swap(b_copy);
        EXPECT_EQ(b_copy.size(), 0);
        EXPECT_EQ(b_range.size(), const_b.size());
        for (size_t i = 0; i < values.size(); ++i) {
            CheckPairEquals(*b_range.find(key_of_value(values[i])), values[i]);
        }
        b_range.swap(b_copy);

        // Test non-member function swap.
        swap(b_range, b_copy);
        EXPECT_EQ(b_copy.size(), 0);
        EXPECT_EQ(b_range.size(), const_b.size());
        for (size_t i = 0; i < values.size(); ++i) {
            CheckPairEquals(*b_range.find(key_of_value(values[i])), values[i]);
        }
        swap(b_range, b_copy);

        // Test erase via values.
        for (size_t i = 0; i < values.size(); ++i) {
            mutable_b.erase(key_of_value(values[i]));
            // Erasing a non-existent key should have no effect.
            ASSERT_EQ(mutable_b.erase(key_of_value(values[i])), 0);
        }

        const_b.verify();
        EXPECT_EQ(const_b.size(), 0);

        // Test erase via iterators.
        mutable_b = b_copy;
        for (size_t i = 0; i < values.size(); ++i) {
            mutable_b.erase(mutable_b.find(key_of_value(values[i])));
        }

        const_b.verify();
        EXPECT_EQ(const_b.size(), 0);

        // Test insert with hint.
        for (size_t i = 0; i < values.size(); i++) {
            mutable_b.insert(mutable_b.upper_bound(key_of_value(values[i])), values[i]);
        }

        const_b.verify();

        // Test range erase.
        mutable_b.erase(mutable_b.begin(), mutable_b.end());
        EXPECT_EQ(mutable_b.size(), 0);
        const_b.verify();

        // First half.
        mutable_b = b_copy;
        typename T::iterator mutable_iter_end = mutable_b.begin();
        for (size_t i = 0; i < values.size() / 2; ++i) ++mutable_iter_end;
        mutable_b.erase(mutable_b.begin(), mutable_iter_end);
        EXPECT_EQ(mutable_b.size(), values.size() - values.size() / 2);
        const_b.verify();

        // Second half.
        mutable_b = b_copy;
        typename T::iterator mutable_iter_begin = mutable_b.begin();
        for (size_t i = 0; i < values.size() / 2; ++i) ++mutable_iter_begin;
        mutable_b.erase(mutable_iter_begin, mutable_b.end());
        EXPECT_EQ(mutable_b.size(), values.size() / 2);
        const_b.verify();

        // Second quarter.
        mutable_b = b_copy;
        mutable_iter_begin = mutable_b.begin();
        for (size_t i = 0; i < values.size() / 4; ++i) ++mutable_iter_begin;
        mutable_iter_end = mutable_iter_begin;
        for (size_t i = 0; i < values.size() / 4; ++i) ++mutable_iter_end;
        mutable_b.erase(mutable_iter_begin, mutable_iter_end);
        EXPECT_EQ(mutable_b.size(), values.size() - values.size() / 4);
        const_b.verify();

        mutable_b.clear();
    }